

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::InternalSwap(Reflection *this,Message *lhs,Message *rhs)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  CppStringType CVar5;
  InternalMetadata *this_00;
  InternalMetadata *other;
  void **__a;
  void **__b;
  bool *v1;
  bool *v2;
  char *failure_msg;
  LogMessage *pLVar6;
  ExtensionSet *this_01;
  ExtensionSet *other_00;
  int local_e4;
  int local_c0;
  int i_5;
  LogMessage local_b0;
  Voidify local_9b;
  bool local_9a;
  bool local_99;
  Nullable<const_char_*> local_98;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FieldDescriptor *pFStack_88;
  int donated_array_size;
  FieldDescriptor *field_2;
  int i_4;
  int inlined_string_count;
  uint32_t *rhs_donated_array;
  uint32_t *lhs_donated_array;
  int i_3;
  int has_bits_size;
  FieldDescriptor *field_1;
  int i_2;
  int fields_with_has_bits;
  uint32_t *rhs_has_bits;
  uint32_t *lhs_has_bits;
  OneofDescriptor *oneof;
  int i_1;
  int oneof_decl_count;
  FieldDescriptor *field;
  Message *pMStack_20;
  int i;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *this_local;
  
  if (lhs != rhs) {
    pMStack_20 = rhs;
    rhs_local = lhs;
    lhs_local = (Message *)this;
    this_00 = MutableInternalMetadata(this,lhs);
    other = MutableInternalMetadata(this,pMStack_20);
    internal::InternalMetadata::InternalSwap(this_00,other);
    for (field._4_4_ = 0; field._4_4_ <= this->last_non_weak_field_index_;
        field._4_4_ = field._4_4_ + 1) {
      _i_1 = Descriptor::field(this->descriptor_,field._4_4_);
      bVar2 = internal::ReflectionSchema::InRealOneof(&this->schema_,_i_1);
      if ((!bVar2) && (bVar2 = internal::ReflectionSchema::IsSplit(&this->schema_,_i_1), !bVar2)) {
        UnsafeShallowSwapField(this,rhs_local,pMStack_20,_i_1);
      }
    }
    bVar2 = internal::ReflectionSchema::IsSplit(&this->schema_);
    if (bVar2) {
      __a = MutableSplitField(this,rhs_local);
      __b = MutableSplitField(this,pMStack_20);
      std::swap<void*>(__a,__b);
    }
    oneof._4_4_ = Descriptor::real_oneof_decl_count(this->descriptor_);
    for (oneof._0_4_ = 0; (int)oneof < oneof._4_4_; oneof._0_4_ = (int)oneof + 1) {
      lhs_has_bits = (uint32_t *)Descriptor::real_oneof_decl(this->descriptor_,(int)oneof);
      SwapOneofField<true>(this,rhs_local,pMStack_20,(OneofDescriptor *)lhs_has_bits);
    }
    bVar2 = internal::ReflectionSchema::HasHasbits(&this->schema_);
    if (bVar2) {
      rhs_has_bits = MutableHasBits(this,rhs_local);
      _i_2 = MutableHasBits(this,pMStack_20);
      field_1._4_4_ = 0;
      for (field_1._0_4_ = 0; iVar1 = (int)field_1,
          iVar3 = Descriptor::field_count(this->descriptor_), iVar1 < iVar3;
          field_1._0_4_ = (int)field_1 + 1) {
        _i_3 = Descriptor::field(this->descriptor_,(int)field_1);
        bVar2 = internal::cpp::HasHasbit(_i_3);
        if (bVar2) {
          field_1._4_4_ = field_1._4_4_ + 1;
        }
      }
      lhs_donated_array._4_4_ = (field_1._4_4_ + 0x1f) / 0x20;
      for (lhs_donated_array._0_4_ = 0; (int)lhs_donated_array < lhs_donated_array._4_4_;
          lhs_donated_array._0_4_ = (int)lhs_donated_array + 1) {
        std::swap<unsigned_int>(rhs_has_bits + (int)lhs_donated_array,_i_2 + (int)lhs_donated_array)
        ;
      }
    }
    bVar2 = internal::ReflectionSchema::HasInlinedString(&this->schema_);
    if (bVar2) {
      rhs_donated_array = MutableInlinedStringDonatedArray(this,rhs_local);
      _i_4 = MutableInlinedStringDonatedArray(this,pMStack_20);
      field_2._4_4_ = 0;
      for (field_2._0_4_ = 0; iVar1 = (int)field_2,
          iVar3 = Descriptor::field_count(this->descriptor_), iVar1 < iVar3;
          field_2._0_4_ = (int)field_2 + 1) {
        pFStack_88 = Descriptor::field(this->descriptor_,(int)field_2);
        CVar4 = FieldDescriptor::cpp_type(pFStack_88);
        if ((((CVar4 == CPPTYPE_STRING) &&
             (bVar2 = FieldDescriptor::is_extension(pFStack_88), !bVar2)) &&
            (bVar2 = FieldDescriptor::is_repeated(pFStack_88), !bVar2)) &&
           (((bVar2 = internal::ReflectionSchema::InRealOneof(&this->schema_,pFStack_88), !bVar2 &&
             (CVar5 = FieldDescriptor::cpp_string_type(pFStack_88), CVar5 == kString)) &&
            (bVar2 = IsInlined(this,pFStack_88), bVar2)))) {
          field_2._4_4_ = field_2._4_4_ + 1;
        }
      }
      if (field_2._4_4_ == 0) {
        local_e4 = 0;
      }
      else {
        local_e4 = (field_2._4_4_ + 0x20) / 0x20;
      }
      absl_log_internal_check_op_result._4_4_ = local_e4;
      local_99 = (*rhs_donated_array & 1) == 0;
      v1 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>(&local_99);
      local_9a = (*_i_4 & 1) == 0;
      v2 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>(&local_9a);
      local_98 = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                           (v1,v2,
                            "(lhs_donated_array[0] & 0x1u) == 0 == (rhs_donated_array[0] & 0x1u) == 0"
                           );
      if (local_98 != (Nullable<const_char_*>)0x0) {
        failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_98);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x541,failure_msg);
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_9b,pLVar6);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b0);
      }
      local_98 = (Nullable<const_char_*>)0x0;
      for (local_c0 = 0; local_c0 < absl_log_internal_check_op_result._4_4_; local_c0 = local_c0 + 1
          ) {
        std::swap<unsigned_int>(rhs_donated_array + local_c0,_i_4 + local_c0);
      }
    }
    bVar2 = internal::ReflectionSchema::HasExtensionSet(&this->schema_);
    if (bVar2) {
      this_01 = MutableExtensionSet(this,rhs_local);
      other_00 = MutableExtensionSet(this,pMStack_20);
      internal::ExtensionSet::InternalSwap(this_01,other_00);
    }
  }
  return;
}

Assistant:

void Reflection::InternalSwap(Message* lhs, Message* rhs) const {
  if (lhs == rhs) return;

  MutableInternalMetadata(lhs)->InternalSwap(MutableInternalMetadata(rhs));

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (schema_.InRealOneof(field)) continue;
    if (schema_.IsSplit(field)) {
      continue;
    }
    UnsafeShallowSwapField(lhs, rhs, field);
  }
  if (schema_.IsSplit()) {
    std::swap(*MutableSplitField(lhs), *MutableSplitField(rhs));
  }
  const int oneof_decl_count = descriptor_->real_oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    const OneofDescriptor* oneof = descriptor_->real_oneof_decl(i);
    SwapOneofField<true>(lhs, rhs, oneof);
  }

  // Swapping bits need to happen after swapping fields, because the latter may
  // depend on the has bit information.
  if (schema_.HasHasbits()) {
    uint32_t* lhs_has_bits = MutableHasBits(lhs);
    uint32_t* rhs_has_bits = MutableHasBits(rhs);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (internal::cpp::HasHasbit(field)) {
        ++fields_with_has_bits;
      }
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(lhs_has_bits[i], rhs_has_bits[i]);
    }
  }

  if (schema_.HasInlinedString()) {
    uint32_t* lhs_donated_array = MutableInlinedStringDonatedArray(lhs);
    uint32_t* rhs_donated_array = MutableInlinedStringDonatedArray(rhs);
    int inlined_string_count = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->cpp_type() != FieldDescriptor::CPPTYPE_STRING) continue;
      if (field->is_extension() || field->is_repeated() ||
          schema_.InRealOneof(field) ||
          field->cpp_string_type() != FieldDescriptor::CppStringType::kString ||
          !IsInlined(field)) {
        continue;
      }
      inlined_string_count++;
    }

    int donated_array_size = inlined_string_count == 0
                                 ? 0
                                 // One extra bit for the arena dtor tracking.
                                 : (inlined_string_count + 1 + 31) / 32;
    ABSL_CHECK_EQ((lhs_donated_array[0] & 0x1u) == 0,
                  (rhs_donated_array[0] & 0x1u) == 0);
    for (int i = 0; i < donated_array_size; i++) {
      std::swap(lhs_donated_array[i], rhs_donated_array[i]);
    }
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(lhs)->InternalSwap(MutableExtensionSet(rhs));
  }
}